

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ndicapi.cxx
# Opt level: O2

char * ndiCommandVA(ndicapi *api,char *format,__va_list_tag *ap)

{
  char cVar1;
  uint *__dest;
  uchar uVar2;
  undefined1 uVar3;
  int j;
  int iVar4;
  int iVar5;
  float (*pafVar6) [3];
  ulong uVar7;
  char (*pacVar9) [8];
  long lVar10;
  ulong uVar11;
  uint *puVar12;
  char *pcVar13;
  byte bVar14;
  uint uVar15;
  char (*pacVar16) [32];
  long lVar17;
  char (*pacVar18) [12];
  char (*pacVar19) [8];
  char (*pacVar20) [24];
  char (*pacVar21) [2];
  char cVar22;
  uint uVar23;
  ulong uVar24;
  ulong uVar25;
  char (*pacVar26) [3];
  byte bVar27;
  char *__s2;
  char (*pacVar28) [52];
  char (*pacVar29) [52];
  char (*pacVar30) [2];
  float *pfVar31;
  float *pfVar32;
  float *pfVar33;
  long lVar34;
  uint uVar35;
  size_t __n;
  char *pcVar36;
  char (*pacVar37) [20];
  bool bVar38;
  bool bVar39;
  bool bVar40;
  float fVar41;
  long lStack_90;
  int errorCode;
  char (*local_68) [52];
  float (*local_60) [3];
  char (*local_58) [24];
  undefined4 local_4c;
  float (*local_48) [8];
  char (*local_40) [8];
  int errorCode_1;
  unsigned_long uVar8;
  
  errorCode = 0;
  pcVar13 = api->Command;
  pcVar36 = api->Reply;
  __dest = (uint *)api->ReplyNoCRC;
  api->ErrorCode = 0;
  *pcVar13 = '\0';
  *pcVar36 = '\0';
  *(char *)__dest = '\0';
  iVar4 = api->SerialDevice;
  if (((iVar4 == -1) && (api->Hostname == (char *)0x0)) && (api->Port < 0)) {
    iVar4 = 0x101;
    goto LAB_00106a41;
  }
  if (format == (char *)0x0) {
    if ((api->IsThreadedMode == true) && (api->IsTracking == true)) {
      ndiMutexLock(api->ThreadMutex);
      iVar4 = api->SerialDevice;
    }
    api->IsTracking = false;
    if (iVar4 == -1) {
      iVar4 = ndiSocketRead(api->Socket,pcVar36,0x7ff,false,&errorCode_1);
    }
    else {
      ndiSerialComm(iVar4,0x2580,"8N1",0);
      ndiSerialFlush(api->SerialDevice,3);
      ndiSerialBreak(api->SerialDevice);
      iVar4 = ndiSerialRead(api->SerialDevice,pcVar36,0x7ff,false,&errorCode);
    }
    iVar5 = strncmp(pcVar36,"RESETBE6F\r",8);
    if (iVar5 == 0) {
      lVar10 = (long)iVar4;
      pcVar36[lVar10] = '\0';
      strncpy((char *)__dest,pcVar36,lVar10 - 5);
      *(char *)((long)__dest + lVar10 + -5) = '\0';
      return (char *)__dest;
    }
    iVar4 = 0x106;
    goto LAB_00106a41;
  }
  vsprintf(pcVar13,format,ap);
  bVar38 = true;
  uVar24 = 0;
  bVar39 = false;
  uVar25 = 0;
  uVar7 = 0;
  while( true ) {
    bVar14 = pcVar13[uVar24];
    if (bVar14 == 0) break;
    bVar27 = bVar14 ^ (byte)(uVar7 & 0xffff);
    uVar15 = (uint)((uVar7 & 0xffff) >> 8);
    if (oddparity[bVar27 & 0xf] != oddparity[bVar27 >> 4]) {
      uVar15 = uVar15 ^ 0xffffc001;
    }
    if (((bVar38) && (bVar39 = (bool)(bVar14 == 0x3a | bVar39), 0x19 < (byte)(bVar14 + 0xbf))) &&
       (9 < (byte)(bVar14 - 0x30))) {
      uVar25 = uVar24 & 0xffffffff;
      bVar38 = false;
    }
    uVar7 = (ulong)((uint)bVar27 << 7 ^ (uint)bVar27 << 6 ^ uVar15);
    uVar24 = uVar24 + 1;
  }
  uVar15 = (uint)uVar25;
  if (bVar38) {
    uVar15 = (uint)uVar24;
  }
  if (bVar39) {
    sprintf(pcVar13 + uVar24,"%04X");
    uVar24 = (ulong)((uint)uVar24 + 4);
  }
  iVar5 = (int)uVar24;
  (pcVar13 + iVar5)[0] = '\r';
  (pcVar13 + iVar5)[1] = '\0';
  __n = (size_t)(int)uVar15;
  iVar4 = strncmp(pcVar13,"BX",__n);
  local_68 = (char (*) [52])CONCAT71(local_68._1_7_,1);
  if (((uVar15 != 2 || iVar4 != 0) &&
      (iVar4 = strncmp(pcVar13,"BX2",__n), uVar15 != 3 || iVar4 != 0)) &&
     (iVar4 = strncmp(pcVar13,"GETLOG",__n), uVar15 != 6 || iVar4 != 0)) {
    iVar4 = strncmp(pcVar13,"VGET",__n);
    local_68 = (char (*) [52])CONCAT71(local_68._1_7_,uVar15 == 4 && iVar4 == 0);
  }
  local_58 = (char (*) [24])CONCAT71(local_58._1_7_,api->IsThreadedMode);
  local_60 = (float (*) [3])__n;
  if (api->IsThreadedMode == true) {
    if (((api->IsTracking != true) || ((uVar15 & 0xfffffffe) != 2)) ||
       (((cVar22 = *pcVar13, cVar22 != 'B' && ((cVar22 != 'T' && (cVar22 != 'G')))) ||
        (pcVar13[1] != 'X')))) {
      if (api->IsTracking != false) {
        ndiMutexLock(api->ThreadMutex);
      }
      goto LAB_0010677e;
    }
    iVar4 = strcmp(pcVar13,api->ThreadCommand);
    if (iVar4 != 0) {
      ndiMutexLock(api->ThreadMutex);
      strcpy(api->ThreadCommand,pcVar13);
      api->IsThreadedCommandBinary = *pcVar13 == 'B';
      ndiMutexUnlock(api->ThreadMutex);
      iVar4 = ndiEventWait(api->ThreadBufferEvent,5000);
      if (iVar4 == 0) goto LAB_001066da;
LAB_001066f0:
      iVar4 = 0x103;
      goto LAB_00106a41;
    }
LAB_001066da:
    iVar4 = ndiEventWait(api->ThreadBufferEvent,5000);
    if (iVar4 != 0) goto LAB_001066f0;
    ndiMutexLock(api->ThreadBufferMutex);
    for (uVar25 = 0; api->ThreadBuffer[uVar25] != '\0'; uVar25 = uVar25 + 1) {
      pcVar36[uVar25] = api->ThreadBuffer[uVar25];
    }
    if ((char)local_68 == '\0') {
      pcVar36[uVar25] = '\0';
    }
    errorCode = api->ThreadErrorCode;
    local_58 = (char (*) [24])CONCAT44(local_58._4_4_,errorCode);
    ndiMutexUnlock(api->ThreadBufferMutex);
    iVar4 = (int)local_58;
  }
  else {
LAB_0010677e:
    if (uVar15 == 4) {
      __s2 = "INIT";
LAB_001067cc:
      iVar4 = strncmp(pcVar13,__s2,__n);
      if (iVar4 == 0) {
        api->IsTracking = false;
      }
    }
    else if (uVar15 == 6) {
      iVar4 = strncmp(pcVar13,"TSTART",__n);
      if (iVar4 == 0) {
        api->IsTracking = true;
        if ((byte)local_58 != '\0') {
          *api->ThreadCommand = '\0';
        }
      }
    }
    else if (uVar15 == 5) {
      __s2 = "TSTOP";
      goto LAB_001067cc;
    }
    if (api->SerialDevice == -1) {
      ndiSocketFlush(api->Socket,1);
    }
    else {
      ndiSerialFlush(api->SerialDevice,1);
    }
    if (api->SerialDevice == -1) {
      iVar4 = ndiSocketWrite(api->Socket,pcVar13,iVar5 + 1);
    }
    else {
      iVar4 = ndiSerialWrite(api->SerialDevice,pcVar13,iVar5 + 1);
    }
    if (iVar4 < 0) {
      errorCode = 0x104;
LAB_00106877:
      uVar25 = 0;
    }
    else {
      if (iVar4 <= iVar5) {
        errorCode = 0x103;
        goto LAB_00106877;
      }
      uVar25 = 0;
      if (errorCode == 0) {
        if (api->SerialDevice == -1) {
          uVar35 = ndiSocketRead(api->Socket,pcVar36,0x7ff,(bool)(char)local_68,&errorCode);
        }
        else {
          uVar35 = ndiSerialRead(api->SerialDevice,pcVar36,0x7ff,(bool)(char)local_68,&errorCode);
        }
        uVar25 = (ulong)uVar35;
        if ((int)uVar35 < 0) {
          errorCode = 0x105;
          uVar25 = 0;
        }
        else if (uVar35 == 0) {
          errorCode = 0x103;
          uVar25 = 0;
        }
        if ((char)local_68 == '\0') {
          pcVar36[uVar25] = '\0';
        }
      }
    }
    iVar4 = errorCode;
    if ((api->IsTracking & (byte)local_58) != 0) {
      ndiMutexUnlock(api->ThreadMutex);
      iVar4 = errorCode;
    }
  }
  if (iVar4 != 0) goto LAB_00106a41;
  uVar23 = (int)uVar25 - 5;
  uVar35 = (int)uVar25 - 2;
  if ((char)local_68 == '\0') {
    uVar35 = uVar23;
  }
  if (-1 < (int)uVar35) {
    uVar25 = (ulong)uVar35;
    uVar24 = 0;
    uVar7 = 0;
    while( true ) {
      uVar11 = uVar7 & 0xffff;
      if (uVar25 == uVar24) break;
      bVar14 = (byte)uVar11 ^ pcVar36[uVar24];
      uVar35 = (uint)uVar11 >> 8;
      if (oddparity[bVar14 & 0xf] != oddparity[bVar14 >> 4]) {
        uVar35 = uVar35 ^ 0xffffc001;
      }
      uVar7 = (ulong)((uint)bVar14 << 7 ^ (uint)bVar14 << 6 ^ uVar35);
      *(char *)((long)__dest + uVar24) = pcVar36[uVar24];
      uVar24 = uVar24 + 1;
    }
    if ((char)local_68 == '\0') {
      *(char *)((long)__dest + uVar25) = '\0';
      uVar8 = ndiHexToUnsignedLong(pcVar36 + uVar23,4);
      if (uVar8 == uVar11) goto LAB_00106a7d;
    }
    else if (*(short *)(pcVar36 + uVar25) == (short)uVar7) {
LAB_00106a7d:
      cVar22 = (char)*__dest;
      iVar4 = (int)cVar22;
      if ((iVar4 == 0x45) && (iVar5 = strncmp((char *)__dest,"ERROR",5), iVar5 == 0)) {
        uVar8 = ndiHexToUnsignedLong((char *)((long)__dest + 5),2);
        iVar4 = (int)uVar8;
        goto LAB_00106a41;
      }
      cVar1 = *pcVar13;
      if (cVar1 == 'B') {
        if ((pcVar13[1] == 'X') && (uVar15 == 2)) {
          uVar25 = 1;
          if (pcVar13[2] == ' ') {
            cVar1 = pcVar13[3];
          }
          else {
            if (pcVar13[2] != ':') goto LAB_00106bcb;
            cVar1 = pcVar13[7];
          }
          if (cVar1 != '\r') {
            uVar25 = ndiHexToUnsignedLong(pcVar13 + 3,4);
          }
LAB_00106bcb:
          if (cVar22 != -0x3c) {
            return (char *)__dest;
          }
          if (*(char *)((long)__dest + 1) == -0x5b) {
            api->BxReplyLength = *(unsigned_short *)((long)__dest + 2);
            pacVar20 = (char (*) [24])(ulong)*(byte *)((long)__dest + 6);
            api->BxHandleCount = *(byte *)((long)__dest + 6);
            local_48 = api->BxTransforms;
            local_68 = (char (*) [52])api->BxToolMarkerInformation;
            local_60 = api->BxActiveSingleStrayMarkerPosition;
            pacVar26 = api->Bx3DMarkerOutOfVolume;
            pcVar13 = api->BxToolMarkerInformation[0] + 1;
            pfVar32 = api->Bx3DMarkerPosition[0][0] + 2;
            pfVar33 = (float *)((long)__dest + 7);
            local_58 = pacVar20;
            for (uVar24 = 0; (char (*) [24])uVar24 != pacVar20; uVar24 = uVar24 + 1) {
              api->BxHandles[uVar24] = *(char *)pfVar33;
              cVar22 = *(char *)((long)pfVar33 + 1);
              api->BxHandlesStatus[uVar24] = cVar22;
              pfVar31 = (float *)((long)pfVar33 + 2);
              if (cVar22 != '\x04') {
                if ((uVar25 & 1) != 0) {
                  if (cVar22 != '\x02') {
                    local_48[uVar24][0] = *(float *)((long)pfVar33 + 2);
                    local_48[uVar24][1] = *(float *)((long)pfVar33 + 6);
                    local_48[uVar24][2] = *(float *)((long)pfVar33 + 10);
                    local_48[uVar24][3] = *(float *)((long)pfVar33 + 0xe);
                    local_48[uVar24][4] = *(float *)((long)pfVar33 + 0x12);
                    local_48[uVar24][5] = *(float *)((long)pfVar33 + 0x16);
                    local_48[uVar24][6] = *(float *)((long)pfVar33 + 0x1a);
                    local_48[uVar24][7] = *(float *)((long)pfVar33 + 0x1e);
                    pfVar31 = (float *)((long)pfVar33 + 0x22);
                  }
                  api->BxPortStatus[uVar24] =
                       (uint)*(byte *)((long)pfVar31 + 3) << 0x18 |
                       (int)*(char *)((long)pfVar31 + 2) << 0x10 |
                       (int)*(char *)((long)pfVar31 + 1) << 8 | (int)*(char *)pfVar31;
                  api->BxFrameNumber[uVar24] = (uint)pfVar31[1];
                  pfVar31 = pfVar31 + 2;
                }
                if ((uVar25 & 2) != 0) {
                  (*(char (*) [11])((long)local_68 + uVar24 * 0xb))[0] = *(char *)pfVar31;
                  for (lVar10 = 0; lVar10 != 10; lVar10 = lVar10 + 1) {
                    pcVar13[lVar10] = *(char *)((long)pfVar31 + lVar10 + 1);
                  }
                  pfVar31 = (float *)((long)pfVar31 + 0xb);
                }
                if ((uVar25 & 4) != 0) {
                  cVar22 = *(char *)pfVar31;
                  api->BxActiveSingleStrayMarkerStatus[uVar24] = cVar22;
                  if (cVar22 == '\0') {
                    pfVar31 = (float *)((long)pfVar31 + 1);
                  }
                  else {
                    local_60[uVar24][0] = *(float *)((long)pfVar31 + 1);
                    local_60[uVar24][1] = *(float *)((long)pfVar31 + 5);
                    local_60[uVar24][2] = *(float *)((long)pfVar31 + 9);
                    pfVar31 = (float *)((long)pfVar31 + 0xd);
                  }
                }
                if ((uVar25 & 8) != 0) {
                  cVar22 = *(char *)pfVar31;
                  api->Bx3DMarkerCount[uVar24] = cVar22;
                  fVar41 = ceilf((float)(int)cVar22 * 0.125);
                  uVar7 = (ulong)(uint)(int)fVar41;
                  if ((int)fVar41 < 1) {
                    uVar7 = 0;
                  }
                  for (uVar11 = 0; uVar7 != uVar11; uVar11 = uVar11 + 1) {
                    (*pacVar26)[uVar11] = *(char *)((long)pfVar31 + uVar11 + 1);
                  }
                  pfVar31 = (float *)((long)pfVar31 + uVar11 + 1);
                  pfVar33 = pfVar32;
                  for (lVar10 = 0; pacVar20 = local_58, lVar10 < api->Bx3DMarkerCount[uVar24];
                      lVar10 = lVar10 + 1) {
                    (*(float (*) [3])(pfVar33 + -2))[0] = *pfVar31;
                    pfVar33[-1] = pfVar31[1];
                    *pfVar33 = pfVar31[2];
                    pfVar31 = pfVar31 + 3;
                    pfVar33 = pfVar33 + 3;
                  }
                }
              }
              pcVar13 = pcVar13 + 0xb;
              pacVar26 = pacVar26 + 1;
              pfVar32 = pfVar32 + 0x3c;
              pfVar33 = pfVar31;
            }
            if (((uint)uVar25 >> 0xc & 1) != 0) {
              cVar22 = *(char *)pfVar33;
              uVar15 = (uint)cVar22;
              api->BxPassiveStrayCount = uVar15;
              fVar41 = ceilf((float)(int)uVar15 * 0.125);
              pcVar13 = api->BxPassiveStrayOutOfVolume;
              uVar25 = 0;
              if (0 < (int)fVar41) {
                uVar25 = (ulong)(uint)(int)fVar41;
              }
              while( true ) {
                pfVar32 = (float *)((long)pfVar33 + 1);
                bVar38 = uVar25 == 0;
                uVar25 = uVar25 - 1;
                if (bVar38) break;
                *pcVar13 = *(char *)pfVar32;
                pcVar13 = pcVar13 + 1;
                pfVar33 = pfVar32;
              }
              uVar24 = 0;
              uVar25 = (ulong)uVar15;
              if (cVar22 < '\x01') {
                uVar25 = uVar24;
              }
              for (; uVar25 * 0xc - uVar24 != 0; uVar24 = uVar24 + 0xc) {
                *(undefined4 *)((long)api->BxPassiveStrayPosition[0] + uVar24) =
                     *(undefined4 *)((long)pfVar32 + uVar24);
                *(undefined4 *)((long)api->BxPassiveStrayPosition[0] + uVar24 + 4) =
                     *(undefined4 *)((long)pfVar33 + uVar24 + 5);
                *(undefined4 *)((long)api->BxPassiveStrayPosition[0] + uVar24 + 8) =
                     *(undefined4 *)((long)pfVar33 + uVar24 + 9);
              }
              pfVar33 = (float *)((long)pfVar32 + uVar24);
            }
            api->BxSystemStatus = (int)*(char *)pfVar33 | (int)*(char *)((long)pfVar33 + 1) << 8;
            return (char *)__dest;
          }
          return (char *)__dest;
        }
        if (((pcVar13[1] == 'X') && (pcVar13[2] == '2')) && (uVar15 == 3)) {
          if (cVar22 == -0x38) {
            if (*(char *)((long)__dest + 1) != -0x5b) {
              return (char *)__dest;
            }
            api->Bx2ReplyLength = 0;
            api->Bx2ReplyLength = *__dest;
            lStack_90 = 4;
          }
          else {
            if (cVar22 != -0x3c) {
              return (char *)__dest;
            }
            if (*(char *)((long)__dest + 1) != -0x5b) {
              return (char *)__dest;
            }
            api->Bx2ReplyLength = 0;
            api->Bx2ReplyLength = (uint)*(ushort *)((long)__dest + 2);
            lStack_90 = 6;
          }
          anon_unknown.dwarf_2bc2::parseComponents(api,(char *)(lStack_90 + (long)__dest));
          return (char *)__dest;
        }
        goto LAB_00106f5f;
      }
      if (cVar1 == 'G') {
        if ((pcVar13[1] != 'X') || (uVar15 != 2)) {
          bVar38 = uVar15 == 4;
LAB_00106ee7:
          local_68 = (char (*) [52])CONCAT44(local_68._4_4_,iVar4);
          local_58 = (char (*) [24])CONCAT71(local_58._1_7_,uVar15 == 5);
          bVar39 = false;
          bVar40 = false;
          goto LAB_00106ffe;
        }
        uVar8 = 1;
        if (pcVar13[2] == ' ') {
          cVar22 = pcVar13[3];
joined_r0x001077b3:
          if ((cVar22 != '\r') && (uVar8 = ndiHexToUnsignedLong(pcVar13 + 3,4), (uVar8 & 1) == 0)) {
            bVar14 = 0;
            puVar12 = __dest;
            goto LAB_001079df;
          }
        }
        else if (pcVar13[2] == ':') {
          cVar22 = pcVar13[7];
          goto joined_r0x001077b3;
        }
        puVar12 = __dest;
        for (uVar15 = 0; uVar15 < 3; uVar15 = uVar15 + 3) {
          pacVar28 = api->GxTransforms;
          for (lVar10 = 0; lVar10 != 3; lVar10 = lVar10 + 1) {
            for (lVar17 = 0; ((int)lVar17 != 0x33 && ('\x1f' < *(char *)((long)puVar12 + lVar17)));
                lVar17 = lVar17 + 1) {
              (*pacVar28)[lVar17] = *(char *)((long)puVar12 + lVar17);
            }
            (*pacVar28)[lVar17] = '\0';
            puVar12 = (uint *)((long)puVar12 +
                              lVar17 + (ulong)(*(char *)((long)puVar12 + lVar17) == '\n'));
            pacVar28 = pacVar28 + 1;
          }
          for (lVar10 = 0; ((int)lVar10 != 8 && ('\x1f' < *(char *)((long)puVar12 + lVar10)));
              lVar10 = lVar10 + 1) {
            api->GxStatus[lVar10] = *(char *)((long)puVar12 + lVar10);
          }
          puVar12 = (uint *)((long)puVar12 + lVar10);
        }
        bVar14 = 1;
        puVar12 = (uint *)((ulong)((char)*puVar12 == '\n') + (long)puVar12);
LAB_001079df:
        if ((uVar8 & 2) != 0) {
          pacVar18 = api->GxInformation;
          for (lVar10 = 0; lVar10 != 3; lVar10 = lVar10 + 1) {
            for (lVar17 = 0; ((int)lVar17 != 0xc && ('\x1f' < *(char *)((long)puVar12 + lVar17)));
                lVar17 = lVar17 + 1) {
              (*pacVar18)[lVar17] = *(char *)((long)puVar12 + lVar17);
            }
            pacVar18 = pacVar18 + 1;
            puVar12 = (uint *)((long)puVar12 + lVar17);
          }
          puVar12 = (uint *)((long)puVar12 + (ulong)((char)*puVar12 == '\n'));
        }
        if ((uVar8 & 4) != 0) {
          pacVar20 = api->GxSingleStray;
          for (lVar10 = 0; lVar10 != 3; lVar10 = lVar10 + 1) {
            for (lVar17 = 0; ((int)lVar17 != 0x15 && ('\x1f' < *(char *)((long)puVar12 + lVar17)));
                lVar17 = lVar17 + 1) {
              (*pacVar20)[lVar17] = *(char *)((long)puVar12 + lVar17);
            }
            (*pacVar20)[lVar17] = '\0';
            puVar12 = (uint *)((long)puVar12 +
                              lVar17 + (ulong)(*(char *)((long)puVar12 + lVar17) == '\n'));
            pacVar20 = pacVar20 + 1;
          }
        }
        if ((uVar8 & 8) != 0) {
          pacVar19 = api->GxFrame;
          for (lVar10 = 0; lVar10 != 3; lVar10 = lVar10 + 1) {
            for (lVar17 = 0; ((int)lVar17 != 8 && ('\x1f' < *(char *)((long)puVar12 + lVar17)));
                lVar17 = lVar17 + 1) {
              (*pacVar19)[lVar17] = *(char *)((long)puVar12 + lVar17);
            }
            pacVar19 = pacVar19 + 1;
            puVar12 = (uint *)((long)puVar12 + lVar17);
          }
          puVar12 = (uint *)((long)puVar12 + (ulong)((char)*puVar12 == '\n'));
        }
        if ((short)uVar8 < 0) {
          uVar25 = 9;
          if (((uint)uVar8 >> 0xd & 1) == 0) {
            uVar25 = 3;
          }
          uVar15 = (uint)uVar25;
          if (!(bool)(~bVar14 & uVar8 != 0x8000)) {
            pacVar28 = api->GxPassiveTransforms;
            pcVar13 = api->GxPassiveStatus;
            uVar24 = 0;
            while (uVar15 = (uint)uVar25, (long)uVar24 < (long)(int)uVar15) {
              pacVar29 = pacVar28;
              for (lVar10 = 0; lVar10 != 3; lVar10 = lVar10 + 1) {
                for (lVar17 = 0;
                    ((int)lVar17 != 0x33 && ('\x1f' < *(char *)((long)puVar12 + lVar17)));
                    lVar17 = lVar17 + 1) {
                  (*pacVar29)[lVar17] = *(char *)((long)puVar12 + lVar17);
                }
                (*pacVar29)[lVar17] = '\0';
                puVar12 = (uint *)((long)puVar12 +
                                  lVar17 + (ulong)(*(char *)((long)puVar12 + lVar17) == '\n'));
                pacVar29 = pacVar29 + 1;
              }
              for (lVar10 = 0;
                  (cVar22 = *(char *)((long)puVar12 + lVar10), (int)lVar10 != 8 && ('\x1f' < cVar22)
                  ); lVar10 = lVar10 + 1) {
                pcVar13[lVar10] = cVar22;
              }
              uVar24 = uVar24 + 3;
              if (cVar22 != '\n') {
                uVar25 = uVar24 & 0xffffffff;
              }
              puVar12 = (uint *)((long)puVar12 + (ulong)(cVar22 == '\n') + lVar10);
              pacVar28 = pacVar28 + 3;
              pcVar13 = pcVar13 + 8;
            }
            puVar12 = (uint *)((long)puVar12 + (ulong)((char)*puVar12 == '\n'));
          }
          if ((uVar8 & 2) != 0) {
            pacVar18 = api->GxPassiveInformation;
            uVar25 = 0;
            uVar24 = 0;
            if (0 < (int)uVar15) {
              uVar24 = (ulong)uVar15;
            }
            for (; uVar25 != uVar24; uVar25 = uVar25 + 1) {
              for (lVar10 = 0; ((int)lVar10 != 0xc && ('\x1f' < *(char *)((long)puVar12 + lVar10)));
                  lVar10 = lVar10 + 1) {
                (*pacVar18)[lVar10] = *(char *)((long)puVar12 + lVar10);
              }
              pacVar18 = pacVar18 + 1;
              puVar12 = (uint *)((long)puVar12 + lVar10);
            }
            puVar12 = (uint *)((long)puVar12 + (ulong)((char)*puVar12 == '\n'));
          }
          if ((uVar8 & 8) != 0) {
            pacVar19 = api->GxPassiveFrame;
            uVar24 = 0;
            uVar25 = (ulong)uVar15;
            if ((int)uVar15 < 1) {
              uVar25 = uVar24;
            }
            for (; uVar24 != uVar25; uVar24 = uVar24 + 1) {
              for (lVar10 = 0; ((int)lVar10 != 8 && ('\x1f' < *(char *)((long)puVar12 + lVar10)));
                  lVar10 = lVar10 + 1) {
                (*pacVar19)[lVar10] = *(char *)((long)puVar12 + lVar10);
              }
              pacVar19 = pacVar19 + 1;
              puVar12 = (uint *)((long)puVar12 + lVar10);
            }
            puVar12 = (uint *)((long)puVar12 + (ulong)((char)*puVar12 == '\n'));
          }
          if (((uint)uVar8 >> 0xc & 1) != 0) {
            lVar10 = 0;
            while( true ) {
              if ((int)lVar10 == 0x1a7) {
                return (char *)__dest;
              }
              if (*(char *)((long)puVar12 + lVar10) < ' ') break;
              api->GxPassiveStray[lVar10] = *(char *)((long)puVar12 + lVar10);
              lVar10 = lVar10 + 1;
            }
            return (char *)__dest;
          }
          return (char *)__dest;
        }
        return (char *)__dest;
      }
      if (cVar1 == 'T') {
        if ((pcVar13[1] == 'X') && (uVar15 == 2)) {
          local_48 = (float (*) [8])0x1;
          if (pcVar13[2] == ' ') {
            cVar22 = pcVar13[3];
          }
          else {
            if (pcVar13[2] != ':') goto LAB_00106b11;
            cVar22 = pcVar13[7];
          }
          if (cVar22 != '\r') {
            local_48 = (float (*) [8])ndiHexToUnsignedLong(pcVar13 + 3,4);
          }
LAB_00106b11:
          pafVar6 = (float (*) [3])ndiHexToUnsignedLong((char *)__dest,2);
          pcVar13 = (char *)((long)__dest + 2);
          for (lVar10 = 0; (int)lVar10 != 2; lVar10 = lVar10 + 1) {
            if (*(char *)((long)__dest + lVar10) < ' ') {
              pcVar13 = (char *)(lVar10 + (long)__dest);
              break;
            }
          }
          local_68 = api->TxTransforms;
          pacVar19 = api->TxStatus;
          local_40 = api->TxFrame;
          pacVar18 = api->TxInformation;
          local_58 = api->TxSingleStray;
          uVar15 = 0;
          while (iVar4 = (int)pafVar6, (int)uVar15 < iVar4) {
            pcVar36 = pcVar13 + 2;
            for (lVar10 = 0; (int)lVar10 != 2; lVar10 = lVar10 + 1) {
              if (pcVar13[lVar10] < ' ') {
                local_60 = pafVar6;
                uVar8 = ndiHexToUnsignedLong(pcVar13,2);
                uVar2 = (uchar)uVar8;
                pcVar36 = pcVar13 + lVar10;
                goto LAB_00107367;
              }
            }
            if (*pcVar36 == 'U') {
              pcVar36 = pcVar13 + 0xc;
              for (lVar10 = 2; (int)lVar10 != 0xc; lVar10 = lVar10 + 1) {
                if (pcVar13[lVar10] < ' ') {
                  pcVar36 = pcVar13 + lVar10;
                  break;
                }
              }
              pafVar6 = (float (*) [3])(ulong)(iVar4 - 1);
              pcVar13 = pcVar36;
            }
            else {
              local_60 = pafVar6;
              uVar8 = ndiHexToUnsignedLong(pcVar13,2);
              uVar2 = (uchar)uVar8;
LAB_00107367:
              api->TxHandles[uVar15] = uVar2;
              if (((ulong)local_48 & 1) != 0) {
                if (*pcVar36 == 'M') {
                  for (lVar10 = 0; ((int)lVar10 != 7 && ('\x1f' < pcVar36[lVar10]));
                      lVar10 = lVar10 + 1) {
                    (*local_68)[lVar10] = pcVar36[lVar10];
                  }
                }
                else if (*pcVar36 == 'D') {
                  for (lVar10 = 0; ((int)lVar10 != 8 && ('\x1f' < pcVar36[lVar10]));
                      lVar10 = lVar10 + 1) {
                    (*local_68)[lVar10] = pcVar36[lVar10];
                  }
                }
                else {
                  for (lVar10 = 0; ((int)lVar10 != 0x33 && ('\x1f' < pcVar36[lVar10]));
                      lVar10 = lVar10 + 1) {
                    (*local_68)[lVar10] = pcVar36[lVar10];
                  }
                }
                (*local_68)[lVar10] = '\0';
                for (lVar17 = 0; ((int)lVar17 != 8 && ('\x1f' < pcVar36[lVar17 + lVar10]));
                    lVar17 = lVar17 + 1) {
                  (*pacVar19)[lVar17] = pcVar36[lVar17 + lVar10];
                }
                pacVar9 = local_40 + uVar15;
                iVar4 = 8;
                for (pcVar36 = pcVar36 + lVar17 + lVar10;
                    (bVar38 = iVar4 != 0, iVar4 = iVar4 + -1, bVar38 && ('\x1f' < *pcVar36));
                    pcVar36 = pcVar36 + 1) {
                  (*pacVar9)[0] = *pcVar36;
                  pacVar9 = (char (*) [8])(*pacVar9 + 1);
                }
              }
              if (((ulong)local_48 & 2) != 0) {
                for (lVar10 = 0; ((int)lVar10 != 0x14 && ('\x1f' < pcVar36[lVar10]));
                    lVar10 = lVar10 + 1) {
                  (*pacVar18)[lVar10] = pcVar36[lVar10];
                }
                pcVar36 = pcVar36 + lVar10;
              }
              if (((ulong)local_48 & 4) != 0) {
                lVar10 = 0;
                if (*pcVar36 == 'M') {
                  for (; ((int)lVar10 != 7 && ('\x1f' < pcVar36[lVar10])); lVar10 = lVar10 + 1) {
                    (*local_58)[lVar10] = pcVar36[lVar10];
                  }
                }
                else if (*pcVar36 == 'D') {
                  for (; ((int)lVar10 != 8 && ('\x1f' < pcVar36[lVar10])); lVar10 = lVar10 + 1) {
                    (*local_58)[lVar10] = pcVar36[lVar10];
                  }
                }
                else {
                  for (; ((int)lVar10 != 0x15 && ('\x1f' < pcVar36[lVar10])); lVar10 = lVar10 + 1) {
                    (*local_58)[lVar10] = pcVar36[lVar10];
                  }
                }
                pcVar36 = pcVar36 + lVar10;
                (*local_58)[lVar10] = '\0';
              }
              pcVar36 = pcVar36 + -1;
              do {
                pcVar13 = pcVar36 + 1;
                pcVar36 = pcVar36 + 1;
              } while ('\x1f' < *pcVar13);
              pcVar13 = pcVar36 + (*pcVar13 == '\n');
              uVar15 = uVar15 + 1;
              local_68 = local_68 + 1;
              pacVar19 = pacVar19 + 1;
              pacVar18 = pacVar18 + 1;
              local_58 = local_58 + 1;
              pafVar6 = local_60;
            }
          }
          api->TxHandleCount = iVar4;
          if (((uint)local_48 >> 0xc & 1) != 0) {
            uVar8 = ndiHexToUnsignedLong(pcVar13,2);
            pcVar36 = pcVar13 + 2;
            for (lVar10 = 0; (int)lVar10 != 2; lVar10 = lVar10 + 1) {
              if (pcVar13[lVar10] < ' ') {
                pcVar36 = pcVar13 + lVar10;
                break;
              }
            }
            iVar4 = 0x32;
            if ((int)uVar8 < 0x32) {
              iVar4 = (int)uVar8;
            }
            api->TxPassiveStrayCount = iVar4;
            pcVar13 = api->TxPassiveStrayOov;
            uVar25 = (long)(iVar4 + 3) / 4;
            uVar24 = 0;
            if (0 < (int)uVar25) {
              uVar24 = uVar25 & 0xffffffff;
            }
            for (; (iVar5 = (int)uVar24, uVar24 = (ulong)(iVar5 - 1), iVar5 != 0 &&
                   ('\x1f' < *pcVar36)); pcVar36 = pcVar36 + 1) {
              *pcVar13 = *pcVar36;
              pcVar13 = pcVar13 + 1;
            }
            uVar24 = 0;
            uVar25 = (ulong)(uint)(iVar4 * 0x15);
            if (iVar4 * 0x15 < 1) {
              uVar25 = uVar24;
            }
            for (; ((int)uVar25 != (int)uVar24 && ('\x1f' < pcVar36[uVar24])); uVar24 = uVar24 + 1)
            {
              api->TxPassiveStray[uVar24] = pcVar36[uVar24];
            }
            api->TxPassiveStray[uVar24] = '\0';
            pcVar13 = pcVar36 + uVar24;
          }
          lVar10 = 0;
          while( true ) {
            if ((int)lVar10 == 4) {
              return (char *)__dest;
            }
            if (pcVar13[lVar10] < ' ') break;
            api->TxSystemStatus[lVar10] = pcVar13[lVar10];
            lVar10 = lVar10 + 1;
          }
          return (char *)__dest;
        }
      }
      else if ((cVar1 == 'C') && (uVar15 == 4)) {
        iVar5 = strncmp(pcVar13,"COMM",(size_t)local_60);
        bVar38 = true;
        if (iVar5 != 0) goto LAB_00106ee7;
        local_4c = 0x314e38;
        bVar14 = pcVar13[5];
        if ((bVar14 & 0xf8) == 0x30) {
          iVar4 = *(int *)("VER:065EE\r" + (ulong)bVar14 * 4 + 2);
        }
        else {
          iVar4 = 0x2580;
          if (bVar14 == 0x41) {
            iVar4 = 0x38400;
          }
        }
        if (pcVar13[6] == '1') {
          local_4c = 0x314e37;
        }
        if (pcVar13[7] == '1') {
          uVar3 = 0x4f;
LAB_00107d02:
          local_4c._0_2_ = CONCAT11(uVar3,(char)local_4c);
        }
        else if (pcVar13[7] == '2') {
          uVar3 = 0x45;
          goto LAB_00107d02;
        }
        if (pcVar13[8] == '1') {
          local_4c = (uint)CONCAT12(0x32,(undefined2)local_4c);
        }
        cVar22 = pcVar13[9];
        ndiSerialSleep(api->SerialDevice,100);
        iVar4 = ndiSerialComm(api->SerialDevice,iVar4,(char *)&local_4c,(uint)(cVar22 == '1'));
        if (iVar4 == 0) {
          return (char *)__dest;
        }
        iVar4 = 0x102;
        goto LAB_00106a41;
      }
LAB_00106f5f:
      bVar38 = uVar15 == 4;
      bVar39 = cVar1 == 'I';
      if ((bVar39) && (bVar38)) {
        iVar5 = strncmp(pcVar13,"INIT",(size_t)local_60);
        bVar39 = true;
        bVar38 = true;
        if (iVar5 == 0) {
          if (api->SerialDevice == -1) {
            ndiSocketSleep(api->Socket,100);
            return (char *)__dest;
          }
          ndiSerialSleep(api->SerialDevice,100);
          return (char *)__dest;
        }
      }
      local_58 = (char (*) [24])CONCAT71(local_58._1_7_,uVar15 == 5);
      if (((!bVar39) || (uVar15 != 5)) ||
         (iVar5 = strncmp(pcVar13,"IRCHK",(size_t)local_60), iVar5 != 0)) {
        local_68 = (char (*) [52])CONCAT44(local_68._4_4_,iVar4);
        bVar40 = cVar1 == 'P';
        bVar39 = false;
        if ((bVar40) && (bVar39 = false, uVar15 == 5)) {
          iVar4 = strncmp(pcVar13,"PHINF",(size_t)local_60);
          pacVar28 = local_68;
          bVar39 = true;
          if (iVar4 == 0) {
            uVar25 = 1;
            if (pcVar13[5] == ' ') {
              cVar22 = pcVar13[6];
joined_r0x00107dc2:
              if (cVar22 != '\r') {
                uVar25 = ndiHexToUnsignedLong(pcVar13 + 8,4);
              }
            }
            else if (pcVar13[5] == ':') {
              cVar22 = pcVar13[10];
              goto joined_r0x00107dc2;
            }
            cVar22 = (char)pacVar28;
            api->PhinfUnoccupied = (uint)(cVar22 == 'U') * 3;
            puVar12 = __dest;
            if ((uVar25 & 1) != 0) {
              pcVar13 = api->PhinfBasic;
              if (cVar22 == 'U') {
                for (iVar4 = 0; iVar4 != 8; iVar4 = iVar4 + 1) {
                  *pcVar13 = '0';
                  pcVar13 = pcVar13 + 1;
                }
                for (lVar10 = 0; (int)lVar10 != 0xc; lVar10 = lVar10 + 1) {
                  pcVar13[lVar10] = ' ';
                }
                for (lVar17 = 0; (int)lVar17 != 0xd; lVar17 = lVar17 + 1) {
                  pcVar13[lVar10 + lVar17] = '0';
                }
              }
              else {
                for (lVar10 = 0;
                    ((int)lVar10 != 0x21 && ('\x1f' < *(char *)((long)__dest + lVar10)));
                    lVar10 = lVar10 + 1) {
                  pcVar13[lVar10] = *(char *)((long)__dest + lVar10);
                }
                puVar12 = (uint *)(lVar10 + (long)__dest);
              }
            }
            if ((uVar25 & 2) != 0) {
              lVar10 = 0;
              if (cVar22 == 'U') {
                for (; (int)lVar10 != 8; lVar10 = lVar10 + 1) {
                  api->PhinfTesting[lVar10] = '0';
                }
              }
              else {
                for (; ((int)lVar10 != 8 && ('\x1f' < *(char *)((long)puVar12 + lVar10)));
                    lVar10 = lVar10 + 1) {
                  api->PhinfTesting[lVar10] = *(char *)((long)puVar12 + lVar10);
                }
                puVar12 = (uint *)((long)puVar12 + lVar10);
              }
            }
            if ((uVar25 & 4) != 0) {
              lVar10 = 0;
              if (cVar22 == 'U') {
                for (; (int)lVar10 != 0x14; lVar10 = lVar10 + 1) {
                  api->PhinfPartNumber[lVar10] = ' ';
                }
              }
              else {
                for (; ((int)lVar10 != 0x14 && ('\x1f' < *(char *)((long)puVar12 + lVar10)));
                    lVar10 = lVar10 + 1) {
                  api->PhinfPartNumber[lVar10] = *(char *)((long)puVar12 + lVar10);
                }
                puVar12 = (uint *)((long)puVar12 + lVar10);
              }
            }
            if ((uVar25 & 8) == 0) {
LAB_00107ed5:
              if ((uVar25 & 0x10) == 0) goto LAB_00107f4a;
              if (cVar22 != 'U') {
                for (lVar10 = 0; ((int)lVar10 != 2 && ('\x1f' < *(char *)((long)puVar12 + lVar10)));
                    lVar10 = lVar10 + 1) {
                  api->PhinfMarkerType[lVar10] = *(char *)((long)puVar12 + lVar10);
                }
                puVar12 = (uint *)((long)puVar12 + lVar10);
                goto LAB_00107f4a;
              }
            }
            else {
              if (cVar22 != 'U') {
                for (lVar10 = 0; ((int)lVar10 != 2 && ('\x1f' < *(char *)((long)puVar12 + lVar10)));
                    lVar10 = lVar10 + 1) {
                  api->PhinfAccessories[lVar10] = *(char *)((long)puVar12 + lVar10);
                }
                puVar12 = (uint *)((long)puVar12 + lVar10);
                goto LAB_00107ed5;
              }
              api->PhinfAccessories[0] = '0';
              api->PhinfAccessories[1] = '0';
              if ((uVar25 & 0x10) == 0) goto LAB_00107f4a;
            }
            api->PhinfMarkerType[0] = '0';
            api->PhinfMarkerType[1] = '0';
LAB_00107f4a:
            if ((uVar25 & 0x20) != 0) {
              lVar10 = 0;
              if (cVar22 == 'U') {
                for (; (int)lVar10 != 0xe; lVar10 = lVar10 + 1) {
                  api->PhinfPortLocation[lVar10] = '0';
                }
              }
              else {
                for (; ((int)lVar10 != 0xe && ('\x1f' < *(char *)((long)puVar12 + lVar10)));
                    lVar10 = lVar10 + 1) {
                  api->PhinfPortLocation[lVar10] = *(char *)((long)puVar12 + lVar10);
                }
                puVar12 = (uint *)((long)puVar12 + lVar10);
              }
            }
            if ((uVar25 & 0x40) != 0) {
              if ((char)local_68 == 'U') {
                api->PhinfGpioStatus[0] = '0';
                api->PhinfGpioStatus[1] = '0';
                return (char *)__dest;
              }
              lVar10 = 0;
              while( true ) {
                if ((int)lVar10 == 2) {
                  return (char *)__dest;
                }
                if (*(char *)((long)puVar12 + lVar10) < ' ') break;
                api->PhinfGpioStatus[lVar10] = *(char *)((long)puVar12 + lVar10);
                lVar10 = lVar10 + 1;
              }
              return (char *)__dest;
            }
            return (char *)__dest;
          }
        }
LAB_00106ffe:
        pafVar6 = local_60;
        if ((bVar40) && (bVar38)) {
          iVar4 = strncmp(pcVar13,"PHRQ",(size_t)local_60);
          if (iVar4 == 0) {
            api->PhrqReply[0] = (char)local_68;
            api->PhrqReply[1] = *(char *)((long)__dest + 1);
            return (char *)__dest;
          }
          iVar4 = strncmp(pcVar13,"PHSR",(size_t)pafVar6);
          if (iVar4 == 0) {
            for (lVar10 = 0; ((int)lVar10 != 0x502 && ('\x1f' < *(char *)((long)__dest + lVar10)));
                lVar10 = lVar10 + 1) {
              api->PhsrReply[lVar10] = *(char *)((long)__dest + lVar10);
            }
            api->PhsrReply[lVar10] = '\0';
            return (char *)__dest;
          }
        }
        if (!bVar39) {
          if ((cVar1 == 'S' & (byte)local_58) != 1) {
            return (char *)__dest;
          }
          iVar4 = strncmp(pcVar13,"SSTAT",(size_t)local_60);
          if (iVar4 == 0) {
            uVar8 = ndiHexToUnsignedLong(pcVar13 + 6,4);
            puVar12 = __dest;
            if ((uVar8 & 1) != 0) {
              api->SstatControl[0] = (char)local_68;
              puVar12 = (uint *)((long)__dest + 2);
              api->SstatControl[1] = *(char *)((long)__dest + 1);
            }
            if ((uVar8 & 2) != 0) {
              api->SstatSensor[0] = (char)*puVar12;
              pcVar13 = (char *)((long)puVar12 + 1);
              puVar12 = (uint *)((long)puVar12 + 2);
              api->SstatSensor[1] = *pcVar13;
            }
            if ((uVar8 & 4) != 0) {
              api->SstatTiu[0] = (char)*puVar12;
              api->SstatTiu[1] = *(char *)((long)puVar12 + 1);
              return (char *)__dest;
            }
            return (char *)__dest;
          }
          return (char *)__dest;
        }
        iVar4 = strncmp(pcVar13,"PSTAT",(size_t)local_60);
        if (iVar4 != 0) {
          return (char *)__dest;
        }
        uVar25 = 1;
        if (pcVar13[5] == ' ') {
          cVar22 = pcVar13[6];
        }
        else {
          if (pcVar13[5] != ':') goto LAB_00107097;
          cVar22 = pcVar13[10];
        }
        if (cVar22 != '\r') {
          uVar25 = ndiHexToUnsignedLong(pcVar13 + 6,4);
        }
LAB_00107097:
        pacVar16 = api->PstatBasic;
        puVar12 = __dest;
        pacVar21 = api->PstatAccessories;
        pacVar30 = api->PstatMarkerType;
        pacVar37 = api->PstatPartNumber;
        pacVar19 = api->PstatTesting;
        for (lVar10 = 0; lVar10 != 3; lVar10 = lVar10 + 1) {
          if ((uVar25 & 1) != 0) {
            for (lVar17 = 0; (int)lVar17 != 0x20; lVar17 = lVar17 + 1) {
              if (*(char *)((long)puVar12 + lVar17) < ' ') {
                (*pacVar16)[lVar17] = '\0';
                break;
              }
              (*pacVar16)[lVar17] = *(char *)((long)puVar12 + lVar17);
            }
            puVar12 = (uint *)((long)puVar12 + lVar17);
          }
          if ((uVar25 & 2) != 0) {
            api->PstatTesting[lVar10][0] = '\0';
            for (lVar17 = 0; ((int)lVar17 != 8 && ('\x1f' < *(char *)((long)puVar12 + lVar17)));
                lVar17 = lVar17 + 1) {
              (*pacVar19)[lVar17] = *(char *)((long)puVar12 + lVar17);
            }
            puVar12 = (uint *)((long)puVar12 + lVar17);
          }
          if ((uVar25 & 4) != 0) {
            api->PstatPartNumber[lVar10][0] = '\0';
            for (lVar17 = 0; ((int)lVar17 != 0x14 && ('\x1f' < *(char *)((long)puVar12 + lVar17)));
                lVar17 = lVar17 + 1) {
              (*pacVar37)[lVar17] = *(char *)((long)puVar12 + lVar17);
            }
            puVar12 = (uint *)((long)puVar12 + lVar17);
          }
          if ((uVar25 & 8) != 0) {
            api->PstatAccessories[lVar10][0] = '\0';
            for (lVar17 = 0; ((int)lVar17 != 2 && ('\x1f' < *(char *)((long)puVar12 + lVar17)));
                lVar17 = lVar17 + 1) {
              (*pacVar21)[lVar17] = *(char *)((long)puVar12 + lVar17);
            }
            puVar12 = (uint *)((long)puVar12 + lVar17);
          }
          if ((uVar25 & 0x10) != 0) {
            api->PstatMarkerType[lVar10][0] = '\0';
            for (lVar17 = 0; ((int)lVar17 != 2 && ('\x1f' < *(char *)((long)puVar12 + lVar17)));
                lVar17 = lVar17 + 1) {
              (*pacVar30)[lVar17] = *(char *)((long)puVar12 + lVar17);
            }
            puVar12 = (uint *)((long)puVar12 + lVar17);
          }
          pcVar13 = (char *)((long)puVar12 + -1);
          do {
            pcVar36 = pcVar13 + 1;
            pcVar13 = pcVar13 + 1;
          } while ('\x1f' < *pcVar36);
          puVar12 = (uint *)(pcVar13 + (*pcVar36 == '\n'));
          pacVar16 = pacVar16 + 1;
          pacVar19 = pacVar19 + 1;
          pacVar37 = pacVar37 + 1;
          pacVar21 = pacVar21 + 1;
          pacVar30 = pacVar30 + 1;
        }
        if (-1 < (short)uVar25) {
          return (char *)__dest;
        }
        lVar10 = 9;
        if (((uint)uVar25 >> 0xd & 1) == 0) {
          lVar10 = 3;
        }
        lVar17 = 0;
        pacVar21 = api->PstatPassiveAccessories;
        pacVar30 = api->PstatPassiveMarkerType;
        pacVar16 = api->PstatPassiveBasic;
        pacVar37 = api->PstatPassivePartNumber;
        pacVar19 = api->PstatPassiveTesting;
        do {
          if (lVar17 == lVar10) {
            return (char *)__dest;
          }
          if ((uVar25 & 1) != 0) {
            api->PstatPassiveBasic[lVar17][0] = '\0';
            for (lVar34 = 0; (int)lVar34 != 0x20; lVar34 = lVar34 + 1) {
              if (*(char *)((long)puVar12 + lVar34) < ' ') {
                (*pacVar16)[lVar34] = '\0';
                break;
              }
              (*pacVar16)[lVar34] = *(char *)((long)puVar12 + lVar34);
            }
            puVar12 = (uint *)((long)puVar12 + lVar34);
          }
          if ((uVar25 & 2) != 0) {
            api->PstatPassiveTesting[lVar17][0] = '\0';
            for (lVar34 = 0; ((int)lVar34 != 8 && ('\x1f' < *(char *)((long)puVar12 + lVar34)));
                lVar34 = lVar34 + 1) {
              (*pacVar19)[lVar34] = *(char *)((long)puVar12 + lVar34);
            }
            puVar12 = (uint *)((long)puVar12 + lVar34);
          }
          if ((uVar25 & 4) != 0) {
            api->PstatPassivePartNumber[lVar17][0] = '\0';
            for (lVar34 = 0; ((int)lVar34 != 0x14 && ('\x1f' < *(char *)((long)puVar12 + lVar34)));
                lVar34 = lVar34 + 1) {
              (*pacVar37)[lVar34] = *(char *)((long)puVar12 + lVar34);
            }
            puVar12 = (uint *)((long)puVar12 + lVar34);
          }
          if ((uVar25 & 8) != 0) {
            api->PstatPassiveAccessories[lVar17][0] = '\0';
            for (lVar34 = 0; ((int)lVar34 != 2 && ('\x1f' < *(char *)((long)puVar12 + lVar34)));
                lVar34 = lVar34 + 1) {
              (*pacVar21)[lVar34] = *(char *)((long)puVar12 + lVar34);
            }
            puVar12 = (uint *)((long)puVar12 + lVar34);
          }
          if ((uVar25 & 0x10) != 0) {
            api->PstatPassiveMarkerType[lVar17][0] = '\0';
            for (lVar34 = 0; ((int)lVar34 != 2 && ('\x1f' < *(char *)((long)puVar12 + lVar34)));
                lVar34 = lVar34 + 1) {
              (*pacVar30)[lVar34] = *(char *)((long)puVar12 + lVar34);
            }
            puVar12 = (uint *)((long)puVar12 + lVar34);
          }
          pcVar13 = (char *)((long)puVar12 + -1);
          do {
            pcVar36 = pcVar13 + 1;
            pcVar13 = pcVar13 + 1;
          } while ('\x1f' < *pcVar36);
          puVar12 = (uint *)(pcVar13 + (*pcVar36 == '\n'));
          lVar17 = lVar17 + 1;
          pacVar16 = pacVar16 + 1;
          pacVar19 = pacVar19 + 1;
          pacVar37 = pacVar37 + 1;
          pacVar21 = pacVar21 + 1;
          pacVar30 = pacVar30 + 1;
        } while( true );
      }
      uVar8 = 0;
      if (pcVar13[5] == ' ') {
        cVar22 = pcVar13[6];
joined_r0x00107c98:
        if ((cVar22 != '\r') &&
           (uVar8 = ndiHexToUnsignedLong(pcVar13 + 6,4), puVar12 = __dest, (uVar8 & 1) == 0))
        goto LAB_00107cbf;
      }
      else if (pcVar13[5] == ':') {
        cVar22 = pcVar13[10];
        goto joined_r0x00107c98;
      }
      api->IrchkDetected = iVar4;
      puVar12 = (uint *)((long)__dest + 1);
LAB_00107cbf:
      if ((uVar8 & 2) == 0) {
        return (char *)__dest;
      }
      lVar10 = 0;
      while( true ) {
        if (lVar10 == 0x7e) {
          return (char *)__dest;
        }
        if (*(char *)((long)puVar12 + lVar10) < ' ') break;
        api->IrchkSources[lVar10] = *(char *)((long)puVar12 + lVar10);
        lVar10 = lVar10 + 1;
      }
      return (char *)__dest;
    }
  }
  iVar4 = 0x100;
LAB_00106a41:
  anon_unknown.dwarf_2bc2::ndiSetError(api,iVar4);
  return (char *)__dest;
}

Assistant:

ndicapiExport char* ndiCommandVA(ndicapi* api, const char* format, va_list ap)
{
  int i, bytes, commandLength;
  bool useCrc = false;
  bool inCommand = true;
  char* command;
  char* reply;
  char* commandReply;
  int errorCode = 0;

  command = api->Command;       // text sent to ndicapi
  reply = api->Reply;     // text received from ndicapi
  commandReply = api->ReplyNoCRC;   // received text, with CRC hacked off
  commandLength = 0;                  // length of 'command' part of command

  api->ErrorCode = 0;                 // clear error
  command[0] = '\0';
  reply[0] = '\0';
  commandReply[0] = '\0';

  // verify that the serial device was opened
  if (api->SerialDevice == NDI_INVALID_HANDLE && api->Hostname == NULL && api->Port < 0)
  {
    ndiSetError(api, NDI_OPEN_ERROR);
    return commandReply;
  }

  // if the command is NULL, send a break to reset the Measurement System
  if (format == NULL)
  {
    if (api->IsThreadedMode && api->IsTracking)
    {
      // block the tracking thread
      ndiMutexLock(api->ThreadMutex);
    }
    api->IsTracking = false;

    if (api->SerialDevice != NDI_INVALID_HANDLE)
    {
      ndiSerialComm(api->SerialDevice, 9600, "8N1", 0);
      ndiSerialFlush(api->SerialDevice, NDI_IOFLUSH);
      ndiSerialBreak(api->SerialDevice);
      bytes = ndiSerialRead(api->SerialDevice, reply, 2047, false, &errorCode);
    }
    else
    {
      int errorCode;
      bytes = ndiSocketRead(api->Socket, reply, 2047, false, &errorCode);
    }

    // check for correct reply
    if (strncmp(reply, "RESETBE6F\r", 8) != 0)
    {
      ndiSetError(api, NDI_RESET_FAIL);
      return commandReply;
    }

    // terminate the reply string
    reply[bytes] = '\0';
    bytes -= 5;
    strncpy(commandReply, reply, bytes);
    commandReply[bytes] = '\0';

    // return the reply string, minus the CRC
    return commandReply;
  }

  vsprintf(command, format, ap);                    // format parameters

  unsigned short CRC16 = 0;                         // calculate CRC
  for (i = 0; command[i] != '\0'; i++)
  {
    CalcCRC16(command[i], &CRC16);
    if (inCommand && command[i] == ':')             // only use CRC if a ':'
    {
      useCrc = true;                                //  follows the command
    }
    if (inCommand && !((command[i] >= 'A' && command[i] <= 'Z') ||
                       (command[i] >= '0' && command[i] <= '9')))
    {
      inCommand = false;                            // 'command' part has ended
      commandLength = i;                            // command length
    }
  }
  if (inCommand)
  {
    // Command was sent with no ':'
    // Example, ndiCommand("INIT");
    commandLength = i;
  }

  if (useCrc)
  {
    sprintf(&command[i], "%04X", CRC16);            // tack on the CRC
    i += 4;
  }

  command[i++] = '\r';                              // tack on carriage return
  command[i] = '\0';                                // terminate for good luck

  bool isBinary = (strncmp(command, "BX", commandLength) == 0 && commandLength == strlen("BX")) ||
                   (strncmp(command, "BX2", commandLength) == 0 && commandLength == strlen("BX2")) ||
                   (strncmp(command, "GETLOG", commandLength) == 0 && commandLength == strlen("GETLOG")) ||
                   (strncmp(command, "VGET", commandLength) == 0 && commandLength == strlen("VGET"));


  // if the command is GX, TX, or BX and thread_mode is on, we copy the reply from
  //  the thread rather than getting it directly from the Measurement System
  if (api->IsThreadedMode && api->IsTracking &&
      (commandLength == 2 || commandLength == 3) && 
        ((command[0] == 'G' && command[1] == 'X') ||
        (command[0] == 'T' && command[1] == 'X') ||
        (command[0] == 'B' && command[1] == 'X') || 
        (command[0] == 'B' && command[1] == 'X' && command[2] == '2')))
  {
    // check that the thread is sending the GX/BX/TX/BX2 command that we want
    if (strcmp(command, api->ThreadCommand) != 0)
    {
      // tell thread to start using the new GX/BX/TX/BX2 command
      ndiMutexLock(api->ThreadMutex);
      strcpy(api->ThreadCommand, command);
      api->IsThreadedCommandBinary = (command[0] == 'B');
      ndiMutexUnlock(api->ThreadMutex);
      // wait for the next data record to arrive (we have to throw it away)
      if (ndiEventWait(api->ThreadBufferEvent, 5000))
      {
        ndiSetError(api, NDI_TIMEOUT);
        return commandReply;
      }
    }
    // there is usually no wait, because usually new data is ready
    if (ndiEventWait(api->ThreadBufferEvent, 5000))
    {
      ndiSetError(api, NDI_TIMEOUT);
      return commandReply;
    }
    // copy the thread's reply buffer into the main reply buffer
    ndiMutexLock(api->ThreadBufferMutex);
    for (bytes = 0; api->ThreadBuffer[bytes] != '\0'; bytes++)
    {
      reply[bytes] = api->ThreadBuffer[bytes];
    }
    if (!isBinary)
    {
      reply[bytes] = '\0';   // terminate string
    }
    errorCode = api->ThreadErrorCode;
    ndiMutexUnlock(api->ThreadBufferMutex);

    if (errorCode != 0)
    {
      ndiSetError(api, errorCode);
      return commandReply;
    }
  }
  // if the command is not a GX or thread_mode is not on, then
  //   send the command directly to the Measurement System and get a reply
  else
  {
    bool isThreadMode = api->IsThreadedMode;

    if (isThreadMode && api->IsTracking)
    {
      // block the tracking thread while we slip this command through
      ndiMutexLock(api->ThreadMutex);
    }

    // change pol->tracking if either TSTOP or TSTART is sent
    if ((commandLength == 5 && strncmp(command, "TSTOP", commandLength) == 0) ||
        (commandLength == 4 && strncmp(command, "INIT", commandLength) == 0))
    {
      api->IsTracking = false;
    }
    else if (commandLength == 6 && strncmp(command, "TSTART", commandLength) == 0)
    {
      api->IsTracking = true;
      if (isThreadMode)
      {
        // this will force the thread to wait until the application sends the first GX command
        api->ThreadCommand[0] = '\0';
      }
    }

    if (api->SerialDevice != NDI_INVALID_HANDLE)
    {
      // flush the input buffer, because anything that we haven't read
      //   yet is garbage left over by a previously failed command
      ndiSerialFlush(api->SerialDevice, NDI_IFLUSH);
    }
    else
    {
      ndiSocketFlush(api->Socket, NDI_IFLUSH);
    }

    // send the command to the Measurement System
    if (api->SerialDevice != NDI_INVALID_HANDLE)
    {
      bytes = ndiSerialWrite(api->SerialDevice, command, i);
    }
    else
    {
      bytes = ndiSocketWrite(api->Socket, command, i);
    }
    if (bytes < 0)
    {
      errorCode = NDI_WRITE_ERROR;
    }
    else if (bytes < i)
    {
      errorCode = NDI_TIMEOUT;
    }

    // read the reply from the Measurement System
    bytes = 0;
    if (errorCode == 0)
    {
      if (api->SerialDevice != NDI_INVALID_HANDLE)
      {
        bytes = ndiSerialRead(api->SerialDevice, reply, 2047, isBinary, &errorCode);
      }
      else
      {
        bytes = ndiSocketRead(api->Socket, reply, 2047, isBinary, &errorCode);
      }
      if (bytes < 0)
      {
        errorCode = NDI_READ_ERROR;
        bytes = 0;
      }
      else if (bytes == 0)
      {
        errorCode = NDI_TIMEOUT;
      }
      if (!isBinary)
      {
        reply[bytes] = '\0';   // terminate string
      }
    }

    if (isThreadMode & api->IsTracking)
    {
      // unblock the tracking thread
      ndiMutexUnlock(api->ThreadMutex);
    }

    if (errorCode != 0)
    {
      ndiSetError(api, errorCode);
      return commandReply;
    }
  }

  // back up to before the CRC
  if (!isBinary)
  {
    bytes -= 5; // 4 ASCII chars
  }
  else
  {
    bytes -= 2; // 2 bytes (unsigned short)
  }
  if (bytes < 0)
  {
    ndiSetError(api, NDI_BAD_CRC);
    return commandReply;
  }

  // calculate the CRC and copy serial_reply to command_reply
  CRC16 = 0;
  for (i = 0; i < bytes; i++)
  {
    CalcCRC16(reply[i], &CRC16);
    commandReply[i] = reply[i];
  }

  if (!isBinary)
  {
    // terminate command_reply before the CRC
    commandReply[i] = '\0';
  }

  if (errorCode != 0)
  {
    // Any above errors are caught here and returned after the command has had its CRC stripped
    return commandReply;
  }

  if (!isBinary)
  {
    // read and check the CRC value of the reply
    if (CRC16 != ndiHexToUnsignedLong(&reply[bytes], 4))
    {
      ndiSetError(api, NDI_BAD_CRC);
      return commandReply;
    }
  }
  else
  {
    unsigned short replyCrc = (unsigned char)reply[bytes + 1] << 8 | (unsigned char)reply[bytes];
    if (replyCrc != CRC16)
    {
      ndiSetError(api, NDI_BAD_CRC);
      return commandReply;
    }
  }

  // check for error code
  if (commandReply[0] == 'E' && strncmp(commandReply, "ERROR", 5) == 0)
  {
    ndiSetError(api, (int)ndiHexToUnsignedLong(&commandReply[5], 2));
    return commandReply;
  }

  // special behavior for specific commands
  if (command[0] == 'T' && command[1] == 'X' && commandLength == 2)   // the TX command
  {
    ndiTXHelper(api, command, commandReply);
  }
  else if (command[0] == 'B' && command[1] == 'X' && commandLength == 2)   // the BX command
  {
    ndiBXHelper(api, command, commandReply);
  }
  else if (command[0] == 'B' && command[1] == 'X' && command[2] == '2' && commandLength == 3)   // the BX2 command
  {
    ndiBX2Helper(api, command, commandReply);
  }
  else if (command[0] == 'G' && command[1] == 'X' && commandLength == 2)   // the GX command
  {
    ndiGXHelper(api, command, commandReply);
  }
  else if (command[0] == 'C' && commandLength == 4 && strncmp(command, "COMM", commandLength) == 0)
  {
    ndiCOMMHelper(api, command, commandReply);
  }
  else if (command[0] == 'I' && commandLength == 4 && strncmp(command, "INIT", commandLength) == 0)
  {
    ndiINITHelper(api, command, commandReply);
  }
  else if (command[0] == 'I' && commandLength == 5 && strncmp(command, "IRCHK", commandLength) == 0)
  {
    ndiIRCHKHelper(api, command, commandReply);
  }
  else if (command[0] == 'P' && commandLength == 5 && strncmp(command, "PHINF", commandLength) == 0)
  {
    ndiPHINFHelper(api, command, commandReply);
  }
  else if (command[0] == 'P' && commandLength == 4 && strncmp(command, "PHRQ", commandLength) == 0)
  {
    ndiPHRQHelper(api, command, commandReply);
  }
  else if (command[0] == 'P' && commandLength == 4 && strncmp(command, "PHSR", commandLength) == 0)
  {
    ndiPHSRHelper(api, command, commandReply);
  }
  else if (command[0] == 'P' && commandLength == 5 && strncmp(command, "PSTAT", commandLength) == 0)
  {
    ndiPSTATHelper(api, command, commandReply);
  }
  else if (command[0] == 'S' && commandLength == 5 && strncmp(command, "SSTAT", commandLength) == 0)
  {
    ndiSSTATHelper(api, command, commandReply);
  }

  // return the Measurement System reply, but with the CRC hacked off
  return commandReply;
}